

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O1

void __thiscall
icu_63::UVector::assign(UVector *this,UVector *other,UElementAssigner *assign,UErrorCode *ec)

{
  void *pvVar1;
  UBool UVar2;
  long lVar3;
  int32_t i;
  long lVar4;
  
  UVar2 = ensureCapacity(this,other->count,ec);
  if (UVar2 != '\0') {
    setSize(this,other->count,ec);
    if ((*ec < U_ILLEGAL_ARGUMENT_ERROR) && (0 < other->count)) {
      lVar3 = 0;
      lVar4 = 0;
      do {
        pvVar1 = *(void **)((long)this->elements + lVar3);
        if ((pvVar1 != (void *)0x0) && (this->deleter != (UObjectDeleter *)0x0)) {
          (*this->deleter)(pvVar1);
        }
        (*assign)((UElement *)((long)this->elements + lVar3),
                  (UElement *)((long)other->elements + lVar3));
        lVar4 = lVar4 + 1;
        lVar3 = lVar3 + 8;
      } while (lVar4 < other->count);
    }
  }
  return;
}

Assistant:

void UVector::assign(const UVector& other, UElementAssigner *assign, UErrorCode &ec) {
    if (ensureCapacity(other.count, ec)) {
        setSize(other.count, ec);
        if (U_SUCCESS(ec)) {
            for (int32_t i=0; i<other.count; ++i) {
                if (elements[i].pointer != 0 && deleter != 0) {
                    (*deleter)(elements[i].pointer);
                }
                (*assign)(&elements[i], &other.elements[i]);
            }
        }
    }
}